

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uncompr.c
# Opt level: O0

int uncompress2(Bytef *dest,uLongf *destLen,Bytef *source,uLong *sourceLen)

{
  int local_d0;
  int local_cc;
  int local_c8;
  uint local_c4;
  uint local_c0;
  undefined1 local_b9;
  uLongf uStack_b8;
  Byte buf [1];
  uLong left;
  uLong len;
  uInt max;
  int err;
  z_stream stream;
  uLong *sourceLen_local;
  Bytef *source_local;
  uLongf *destLen_local;
  Bytef *dest_local;
  
  left = *sourceLen;
  if (*destLen == 0) {
    uStack_b8 = 1;
    destLen_local = (uLongf *)&local_b9;
  }
  else {
    uStack_b8 = *destLen;
    *destLen = 0;
    destLen_local = (uLongf *)dest;
  }
  stream.next_in._0_4_ = 0;
  stream.state = (internal_state *)0x0;
  stream.zalloc = (alloc_func)0x0;
  stream.zfree = (free_func)0x0;
  _max = source;
  stream.reserved = (uLong)sourceLen;
  dest_local._4_4_ = inflateInit_((z_streamp)&max,"1.2.11",0x70);
  if (dest_local._4_4_ == 0) {
    stream.total_in = (uLong)destLen_local;
    stream.next_out._0_4_ = 0;
    do {
      if ((uint)stream.next_out == 0) {
        if (uStack_b8 < 0x100000000) {
          local_c0 = (uint)uStack_b8;
        }
        else {
          local_c0 = 0xffffffff;
        }
        stream.next_out._0_4_ = local_c0;
        uStack_b8 = uStack_b8 - local_c0;
      }
      if ((uint)stream.next_in == 0) {
        if (left < 0x100000000) {
          local_c4 = (uint)left;
        }
        else {
          local_c4 = 0xffffffff;
        }
        stream.next_in._0_4_ = local_c4;
        left = left - local_c4;
      }
      local_d0 = inflate((z_streamp)&max,0);
    } while (local_d0 == 0);
    *(uLong *)stream.reserved = *(long *)stream.reserved - (left + (uint)stream.next_in);
    if (destLen_local == (uLongf *)&local_b9) {
      if ((stream._32_8_ != 0) && (local_d0 == -5)) {
        uStack_b8 = 1;
      }
    }
    else {
      *destLen = stream._32_8_;
    }
    inflateEnd((z_streamp)&max);
    if (local_d0 == 1) {
      local_c8 = 0;
    }
    else {
      if (local_d0 == 2) {
        local_cc = -3;
      }
      else {
        if ((local_d0 == -5) && (uStack_b8 + (uint)stream.next_out != 0)) {
          local_d0 = -3;
        }
        local_cc = local_d0;
      }
      local_c8 = local_cc;
    }
    dest_local._4_4_ = local_c8;
  }
  return dest_local._4_4_;
}

Assistant:

int ZEXPORT uncompress2 (dest, destLen, source, sourceLen)
    Bytef *dest;
    uLongf *destLen;
    const Bytef *source;
    uLong *sourceLen;
{
    z_stream stream;
    int err;
    const uInt max = (uInt)-1;
    uLong len, left;
    Byte buf[1];    /* for detection of incomplete stream when *destLen == 0 */

    len = *sourceLen;
    if (*destLen) {
        left = *destLen;
        *destLen = 0;
    }
    else {
        left = 1;
        dest = buf;
    }

    stream.next_in = (z_const Bytef *)source;
    stream.avail_in = 0;
    stream.zalloc = (alloc_func)0;
    stream.zfree = (free_func)0;
    stream.opaque = (voidpf)0;

    err = inflateInit(&stream);
    if (err != Z_OK) return err;

    stream.next_out = dest;
    stream.avail_out = 0;

    do {
        if (stream.avail_out == 0) {
            stream.avail_out = left > (uLong)max ? max : (uInt)left;
            left -= stream.avail_out;
        }
        if (stream.avail_in == 0) {
            stream.avail_in = len > (uLong)max ? max : (uInt)len;
            len -= stream.avail_in;
        }
        err = inflate(&stream, Z_NO_FLUSH);
    } while (err == Z_OK);

    *sourceLen -= len + stream.avail_in;
    if (dest != buf)
        *destLen = stream.total_out;
    else if (stream.total_out && err == Z_BUF_ERROR)
        left = 1;

    inflateEnd(&stream);
    return err == Z_STREAM_END ? Z_OK :
           err == Z_NEED_DICT ? Z_DATA_ERROR  :
           err == Z_BUF_ERROR && left + stream.avail_out ? Z_DATA_ERROR :
           err;
}